

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalNestedLoopJoin::PhysicalNestedLoopJoin
          (PhysicalNestedLoopJoin *this,LogicalOperator *op,PhysicalOperator *left,
          PhysicalOperator *right,vector<duckdb::JoinCondition,_true> *cond,JoinType join_type,
          idx_t estimated_cardinality)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  reference_wrapper<duckdb::PhysicalOperator> local_40;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_38;
  
  local_38.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_start =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalComparisonJoin::PhysicalComparisonJoin
            (&this->super_PhysicalComparisonJoin,op,NESTED_LOOP_JOIN,
             (vector<duckdb::JoinCondition,_true> *)&local_38,join_type,estimated_cardinality);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_38);
  (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
  super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalComparisonJoin_027b9a28;
  this_00 = &(this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
             super_PhysicalOperator.children;
  local_40._M_data = left;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)this_00,&local_40);
  local_40._M_data = right;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)this_00,&local_40);
  return;
}

Assistant:

PhysicalNestedLoopJoin::PhysicalNestedLoopJoin(LogicalOperator &op, PhysicalOperator &left, PhysicalOperator &right,
                                               vector<JoinCondition> cond, JoinType join_type,
                                               idx_t estimated_cardinality)
    : PhysicalComparisonJoin(op, PhysicalOperatorType::NESTED_LOOP_JOIN, std::move(cond), join_type,
                             estimated_cardinality) {
	children.push_back(left);
	children.push_back(right);
}